

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

int nlohmann::detail::dtoa_impl::find_largest_pow10(uint32_t n,uint32_t *pow10)

{
  int iVar1;
  uint32_t uVar2;
  
  if (n < 1000000000) {
    if (n < 100000000) {
      if (n < 10000000) {
        if (n < 1000000) {
          if (n < 100000) {
            if (n < 10000) {
              if (n < 1000) {
                if (n < 100) {
                  uVar2 = (uint)(9 < n) * 9 + 1;
                  iVar1 = (9 < n) + 1;
                }
                else {
                  iVar1 = 3;
                  uVar2 = 100;
                }
              }
              else {
                iVar1 = 4;
                uVar2 = 1000;
              }
            }
            else {
              iVar1 = 5;
              uVar2 = 10000;
            }
          }
          else {
            iVar1 = 6;
            uVar2 = 100000;
          }
        }
        else {
          iVar1 = 7;
          uVar2 = 1000000;
        }
      }
      else {
        iVar1 = 8;
        uVar2 = 10000000;
      }
    }
    else {
      iVar1 = 9;
      uVar2 = 100000000;
    }
  }
  else {
    iVar1 = 10;
    uVar2 = 1000000000;
  }
  *pow10 = uVar2;
  return iVar1;
}

Assistant:

inline int find_largest_pow10(const std::uint32_t n, std::uint32_t& pow10)
{
// LCOV_EXCL_START
if (n >= 1000000000)
{
pow10 = 1000000000;
return 10;
}
// LCOV_EXCL_STOP
else if (n >= 100000000)
{
pow10 = 100000000;
return  9;
}
else if (n >= 10000000)
{
pow10 = 10000000;
return  8;
}
else if (n >= 1000000)
{
pow10 = 1000000;
return  7;
}
else if (n >= 100000)
{
pow10 = 100000;
return  6;
}
else if (n >= 10000)
{
pow10 = 10000;
return  5;
}
else if (n >= 1000)
{
pow10 = 1000;
return  4;
}
else if (n >= 100)
{
pow10 = 100;
return  3;
}
else if (n >= 10)
{
pow10 = 10;
return  2;
}
else
{
pow10 = 1;
return 1;
}
}